

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

void queueReaderRegisterMsgAndNotify(SstStream Stream,_ReaderRegisterMsg *Req,CMConnection conn)

{
  _RegisterQueue *p_Var1;
  _RegisterQueue *p_Var2;
  RegisterQueue *pp_Var3;
  RegisterQueue p_Var4;
  
  pthread_mutex_lock((pthread_mutex_t *)&Stream->DataLock);
  p_Var2 = (_RegisterQueue *)malloc(0x18);
  p_Var2->Msg = Req;
  p_Var2->Conn = conn;
  p_Var2->Next = (_RegisterQueue *)0x0;
  p_Var1 = Stream->ReaderRegisterQueue;
  if (Stream->ReaderRegisterQueue == (RegisterQueue)0x0) {
    pp_Var3 = &Stream->ReaderRegisterQueue;
  }
  else {
    do {
      p_Var4 = p_Var1;
      p_Var1 = p_Var4->Next;
    } while (p_Var1 != (_RegisterQueue *)0x0);
    pp_Var3 = &p_Var4->Next;
  }
  *pp_Var3 = p_Var2;
  pthread_cond_signal((pthread_cond_t *)&Stream->DataCondition);
  pthread_mutex_unlock((pthread_mutex_t *)&Stream->DataLock);
  return;
}

Assistant:

void queueReaderRegisterMsgAndNotify(SstStream Stream, struct _ReaderRegisterMsg *Req,
                                     CMConnection conn)
{
    STREAM_MUTEX_LOCK(Stream);
    RegisterQueue New = malloc(sizeof(struct _RegisterQueue));
    New->Msg = Req;
    New->Conn = conn;
    New->Next = NULL;
    if (Stream->ReaderRegisterQueue)
    {
        RegisterQueue Last = Stream->ReaderRegisterQueue;
        while (Last->Next)
        {
            Last = Last->Next;
        }
        Last->Next = New;
    }
    else
    {
        Stream->ReaderRegisterQueue = New;
    }
    STREAM_CONDITION_SIGNAL(Stream);
    STREAM_MUTEX_UNLOCK(Stream);
}